

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wheel.hpp
# Opt level: O3

void __thiscall
primesum::Wheel::Wheel<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Wheel *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *primes,int64_t size,
          int64_t low)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int64_t wheel_index;
  undefined8 local_40;
  undefined8 local_38;
  
  (this->wheel_).super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->wheel_).super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->wheel_).super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>::reserve
            (&this->wheel_,size);
  local_38 = (ulong)local_38._4_4_ << 0x20;
  local_40 = (ulong)local_40._4_4_ << 0x20;
  std::vector<primesum::WheelItem,std::allocator<primesum::WheelItem>>::emplace_back<int,int>
            ((vector<primesum::WheelItem,std::allocator<primesum::WheelItem>> *)this,
             (int *)&local_38,(int *)&local_40);
  if (1 < size) {
    lVar4 = 1;
    do {
      uVar3 = (ulong)(primes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[lVar4];
      lVar1 = (long)(low + -1 + uVar3) / (long)uVar3;
      lVar2 = lVar1 % 0xd2;
      local_40 = (long)(char)init[lVar2 * 2 + 1];
      local_38 = ((char)init[lVar2 * 2] + lVar1) * uVar3;
      std::vector<primesum::WheelItem,std::allocator<primesum::WheelItem>>::
      emplace_back<long&,long&>
                ((vector<primesum::WheelItem,std::allocator<primesum::WheelItem>> *)this,&local_38,
                 &local_40);
      lVar4 = lVar4 + 1;
    } while (size != lVar4);
  }
  return;
}

Assistant:

Wheel(Primes& primes,
        int64_t size,
        int64_t low)
  {
    wheel_.reserve(size);
    wheel_.emplace_back(0, 0);

    for (int64_t b = 1; b < size; b++)
    {
      int64_t prime = primes[b];
      int64_t quotient = ceil_div(low, prime);

      // first multiple >= low
      int64_t multiple = prime * quotient;

      // calculate the next multiple of prime that
      // is not divisible by any of the wheel's
      // prime factors (2, 3, 5, 7)
      int64_t next_multiple_factor = init[quotient % 210].next_multiple_factor;
      int64_t wheel_index = init[quotient % 210].wheel_index;
      multiple += prime * next_multiple_factor;

      wheel_.emplace_back(multiple, wheel_index);
    }
  }